

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O2

bool __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::PrepareNextSolveIteration
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,function<mp::sol::Status_()> *get_stt,function<mp::Solution_()> *get_sol)

{
  int iVar1;
  bool bVar2;
  function<mp::Solution_()> local_50;
  function<mp::sol::Status_()> local_30;
  
  if (((this->
       super_MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
       ).status_ & ~NOT_ACTIVE) == RUNNING) {
    std::function<mp::sol::Status_()>::function(&local_30,get_stt);
    std::function<mp::Solution_()>::function(&local_50,get_sol);
    bVar2 = MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            ::PrepareMOIteration
                      (&this->
                        super_MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                       ,&local_30,&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    std::_Function_base::~_Function_base(&local_30.super__Function_base);
  }
  else {
    iVar1 = this->n_solve_iter_;
    this->n_solve_iter_ = iVar1 + 1;
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool PrepareNextSolveIteration(
      std::function<sol::Status(void)> get_stt, std::function<Solution(void)> get_sol) {
    if (MPCD( IsMOActive() ))
      return MPD( PrepareMOIteration(get_stt, get_sol) );
    return !(n_solve_iter_++);
  }